

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O3

bool __thiscall AddressFilter::IsInList(AddressFilter *this,uint8_t *addr,size_t len)

{
  IPAsKey *pIVar1;
  size_t __n;
  IPAsKey key;
  IPAsKey local_48;
  
  local_48._vptr_IPAsKey = (_func_int **)&PTR__IPAsKeyLRU_001ac520;
  local_48.HashNext = (IPAsKey *)0x0;
  local_48.count = 1;
  local_48.hash = 0;
  __n = 0x10;
  if (len < 0x10) {
    __n = len;
  }
  memcpy(local_48.addr,addr,__n);
  local_48.addr_len = __n;
  pIVar1 = BinHash<IPAsKey>::Retrieve(&this->table,&local_48);
  return pIVar1 != (IPAsKey *)0x0;
}

Assistant:

bool AddressFilter::IsInList(uint8_t * addr, size_t len)
{
    IPAsKey key(addr, len);
    IPAsKey * ret = table.Retrieve(&key);

    return (ret != NULL);
}